

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void UYVYToARGBRow_C(uint8 *src_uyvy,uint8 *rgb_buf,YuvConstants *yuvconstants,int width)

{
  int local_28;
  int x;
  int width_local;
  YuvConstants *yuvconstants_local;
  uint8 *rgb_buf_local;
  uint8 *src_uyvy_local;
  
  yuvconstants_local = (YuvConstants *)rgb_buf;
  rgb_buf_local = src_uyvy;
  for (local_28 = 0; local_28 < width + -1; local_28 = local_28 + 2) {
    libyuv::YuvPixel(rgb_buf_local[1],*rgb_buf_local,rgb_buf_local[2],(uint8 *)yuvconstants_local,
                     (uint8 *)(yuvconstants_local->kUVToB + 1),
                     (uint8 *)(yuvconstants_local->kUVToB + 2),yuvconstants);
    yuvconstants_local->kUVToB[3] = -1;
    libyuv::YuvPixel(rgb_buf_local[3],*rgb_buf_local,rgb_buf_local[2],
                     (uint8 *)(yuvconstants_local->kUVToB + 4),
                     (uint8 *)(yuvconstants_local->kUVToB + 5),
                     (uint8 *)(yuvconstants_local->kUVToB + 6),yuvconstants);
    yuvconstants_local->kUVToB[7] = -1;
    rgb_buf_local = rgb_buf_local + 4;
    yuvconstants_local = (YuvConstants *)(yuvconstants_local->kUVToB + 8);
  }
  if ((width & 1U) != 0) {
    libyuv::YuvPixel(rgb_buf_local[1],*rgb_buf_local,rgb_buf_local[2],(uint8 *)yuvconstants_local,
                     (uint8 *)(yuvconstants_local->kUVToB + 1),
                     (uint8 *)(yuvconstants_local->kUVToB + 2),yuvconstants);
    yuvconstants_local->kUVToB[3] = -1;
  }
  return;
}

Assistant:

void UYVYToARGBRow_C(const uint8* src_uyvy,
                     uint8* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_uyvy[1], src_uyvy[0], src_uyvy[2], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YuvPixel(src_uyvy[3], src_uyvy[0], src_uyvy[2], rgb_buf + 4, rgb_buf + 5,
             rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_uyvy += 4;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_uyvy[1], src_uyvy[0], src_uyvy[2], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}